

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void __thiscall
spatial_region::f_init_focused
          (spatial_region *this,double a0y,double a0z,double xsigma,double sigma0,double x0,
          double x1,bool b_sign,double phase,double y0,double z0,bool append,double phi,int sscos,
          double K,double xtarget,double ytarget,double ztarget)

{
  celle ***pppcVar1;
  cellb ***pppcVar2;
  int in_ECX;
  byte in_DL;
  byte in_SIL;
  int *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar12;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined8 uVar118;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar17;
  double dVar18;
  double dVar19;
  undefined1 auVar44 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  double dVar22;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  double in_XMM1_Qa;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [64];
  double in_XMM2_Qa;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  double in_XMM3_Qa;
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  ulong in_XMM4_Qa;
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  double in_XMM5_Qa;
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar498 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  ulong in_XMM6_Qa;
  undefined1 auVar503 [16];
  undefined1 auVar504 [16];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  double in_XMM7_Qa;
  undefined1 auVar507 [16];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  double in_stack_00000020;
  double in_stack_00000028;
  double in_stack_00000030;
  double xxi_1;
  double xxi;
  int k;
  int j;
  int i;
  double bz;
  double by;
  double bx;
  double ez;
  double ey;
  double ex;
  double alocal;
  double slocal;
  double sinr;
  double sinx;
  double cosr;
  double cosx;
  double r;
  double x;
  double xi;
  double zz;
  double zy;
  double zx;
  double yz;
  double yy;
  double yx;
  double s_1;
  double c;
  double z0z;
  double z0y;
  double z0x;
  double y0z;
  double y0y;
  double y0x;
  double r0z;
  double r0y;
  double r0x;
  double z12;
  double y12;
  double s0;
  double s;
  double xs;
  double a_multiplier;
  double sigma;
  double xR;
  double sign;
  double in_stack_fffffffffffff9b8;
  int iVar515;
  field3d<cellb> *in_stack_fffffffffffff9c0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  double local_1a0;
  double local_198;
  ulong local_190;
  double local_188;
  double local_180;
  ulong local_178;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_80;
  double local_38;
  
  auVar23._8_8_ = 0;
  auVar23._0_8_ = in_XMM5_Qa;
  auVar266._8_8_ = 0;
  auVar266._0_8_ = in_XMM5_Qa;
  auVar119._8_8_ = 0;
  auVar119._0_8_ = in_XMM7_Qa * in_XMM7_Qa;
  auVar23 = vfmadd213sd_fma(auVar266,auVar23,auVar119);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = in_stack_00000008;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = in_stack_00000008;
  auVar23 = vfmadd213sd_fma(auVar24,auVar120,auVar23);
  local_38 = sqrt(auVar23._0_8_);
  if ((local_38 == 0.0) && (!NAN(local_38))) {
    local_38 = *(double *)(in_RDI + 4);
  }
  dVar3 = (in_stack_00000018 * in_XMM3_Qa * in_XMM3_Qa) / 2.0;
  dVar4 = sqrt(((local_38 * local_38) / dVar3) / dVar3 + 1.0);
  dVar5 = sqrt((local_38 * local_38) / ((in_XMM3_Qa * in_XMM3_Qa * in_XMM3_Qa * in_XMM3_Qa) / 4.0) +
               1.0);
  dVar6 = sqrt((local_38 * local_38) / (dVar3 * dVar3) + 1.0);
  dVar7 = sqrt(6.283185307179586);
  local_80 = (in_XMM2_Qa * 2.0 * dVar7) / 3.0;
  if (in_ECX == 1) {
    local_80 = in_XMM2_Qa * 0.822;
  }
  dVar7 = sqrt(0.08617881635766222);
  dVar8 = sqrt(0.08617881635766222);
  dVar8 = (in_XMM3_Qa / 2.0) / dVar8;
  dVar9 = ((double)in_RDI[1] * *(double *)(in_RDI + 6)) / 2.0;
  dVar10 = ((double)in_RDI[2] * *(double *)(in_RDI + 8)) / 2.0;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_38;
  auVar267._8_8_ = 0;
  auVar267._0_8_ = local_38;
  auVar121._8_8_ = 0;
  auVar121._0_8_ = -(in_XMM7_Qa * in_XMM7_Qa);
  auVar23 = vfmadd213sd_fma(auVar267,auVar25,auVar121);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = in_stack_00000008;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = -in_stack_00000008;
  auVar23 = vfmadd213sd_fma(auVar26,auVar122,auVar23);
  dVar11 = sqrt(auVar23._0_8_);
  auVar27._0_8_ =
       ((double)(int)((uint)(in_XMM5_Qa <= 0.0) - (uint)(0.0 < in_XMM5_Qa)) * dVar11) / local_38;
  dVar11 = -in_XMM7_Qa / local_38;
  dVar12 = -in_stack_00000008 / local_38;
  auVar123._8_8_ = 0;
  auVar123._0_8_ = auVar27._0_8_;
  auVar27._8_8_ = 0;
  auVar268._8_8_ = 0;
  auVar268._0_8_ = dVar11 * dVar11;
  auVar23 = vfmadd213sd_fma(auVar27,auVar123,auVar268);
  local_c8 = sqrt(auVar23._0_8_);
  if ((local_c8 != 0.0) || (NAN(local_c8))) {
    local_c0 = -dVar11 / local_c8;
    local_c8 = auVar27._0_8_ / local_c8;
  }
  else {
    local_c0 = 0.0;
    local_c8 = 1.0;
  }
  local_d0 = 0.0;
  auVar124._8_8_ = 0;
  auVar124._0_8_ = dVar11;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = -(dVar12 * local_c8);
  auVar23 = vfmadd213sd_fma(ZEXT816(0),auVar124,auVar269);
  local_d8 = auVar23._0_8_;
  auVar125._8_8_ = 0;
  auVar125._0_8_ = dVar12;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_c0;
  auVar270._8_8_ = 0;
  auVar270._0_8_ = -(auVar27._0_8_ * 0.0);
  auVar23 = vfmadd213sd_fma(auVar28,auVar125,auVar270);
  local_e0 = auVar23._0_8_;
  auVar126._8_8_ = 0;
  auVar126._0_8_ = auVar27._0_8_;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = local_c8;
  auVar271._8_8_ = 0;
  auVar271._0_8_ = -(dVar11 * local_c0);
  auVar23 = vfmadd213sd_fma(auVar29,auVar126,auVar271);
  local_e8 = auVar23._0_8_;
  auVar131 = ZEXT816(0);
  if ((in_stack_00000010 != 0.0) || (NAN(in_stack_00000010))) {
    auVar30._0_8_ = cos(in_stack_00000010);
    dVar14 = sin(in_stack_00000010);
    auVar127._8_8_ = 0;
    auVar127._0_8_ = local_c0;
    auVar30._8_8_ = 0;
    auVar272._8_8_ = 0;
    auVar272._0_8_ = local_d8 * dVar14;
    auVar23 = vfmadd213sd_fma(auVar30,auVar127,auVar272);
    auVar128._8_8_ = 0;
    auVar128._0_8_ = local_c8;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = auVar30._0_8_;
    auVar273._8_8_ = 0;
    auVar273._0_8_ = local_e0 * dVar14;
    auVar24 = vfmadd213sd_fma(auVar31,auVar128,auVar273);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = auVar30._0_8_;
    auVar274._8_8_ = 0;
    auVar274._0_8_ = local_e8 * dVar14;
    auVar119 = vfmadd213sd_fma(auVar32,ZEXT816(0),auVar274);
    local_d0 = auVar119._0_8_;
    auVar129._8_8_ = 0;
    auVar129._0_8_ = local_d8;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = auVar30._0_8_;
    auVar275._8_8_ = 0;
    auVar275._0_8_ = -(local_c0 * dVar14);
    auVar119 = vfmadd213sd_fma(auVar33,auVar129,auVar275);
    local_d8 = auVar119._0_8_;
    auVar130._8_8_ = 0;
    auVar130._0_8_ = local_e0;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = auVar30._0_8_;
    auVar276._8_8_ = 0;
    auVar276._0_8_ = -(local_c8 * dVar14);
    auVar119 = vfmadd213sd_fma(auVar34,auVar130,auVar276);
    local_e0 = auVar119._0_8_;
    auVar131._8_8_ = 0;
    auVar131._0_8_ = local_e8;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = auVar30._0_8_;
    auVar277._8_8_ = 0;
    auVar277._0_8_ = -(dVar14 * 0.0);
    auVar119 = vfmadd213sd_fma(auVar35,auVar131,auVar277);
    local_e8 = auVar119._0_8_;
    local_c8 = auVar24._0_8_;
    local_c0 = auVar23._0_8_;
  }
  auVar265 = ZEXT1664(auVar131);
  for (local_1a4 = 0; local_1a4 < *in_RDI; local_1a4 = local_1a4 + 1) {
    for (local_1a8 = 0; local_1a8 < in_RDI[1]; local_1a8 = local_1a8 + 1) {
      for (local_1ac = 0; local_1ac < in_RDI[2]; local_1ac = local_1ac + 1) {
        auVar36._8_8_ = 0;
        auVar36._0_8_ = auVar27._0_8_;
        auVar278._0_8_ = (double)local_1a4;
        auVar278._8_8_ = auVar265._8_8_;
        auVar132._8_8_ = 0;
        auVar132._0_8_ = *(ulong *)(in_RDI + 4);
        auVar386._8_8_ = 0;
        auVar386._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
        auVar23 = vfmadd213sd_fma(auVar132,auVar278,auVar386);
        auVar447._0_8_ = (double)local_1a8;
        auVar447._8_8_ = 0;
        auVar387._8_8_ = 0;
        auVar387._0_8_ = *(ulong *)(in_RDI + 6);
        auVar485._8_8_ = 0;
        auVar485._0_8_ = -dVar9;
        auVar24 = vfmadd213sd_fma(auVar387,auVar447,auVar485);
        auVar133._8_8_ = 0;
        auVar133._0_8_ = dVar11 * ((auVar24._0_8_ - in_XMM7_Qa) - in_stack_00000028);
        auVar279._8_8_ = 0;
        auVar279._0_8_ = auVar23._0_8_ - in_stack_00000020;
        auVar23 = vfmadd213sd_fma(auVar279,auVar36,auVar133);
        auVar134._8_8_ = 0;
        auVar134._0_8_ = dVar12;
        auVar388._0_8_ = (double)local_1ac;
        auVar388._8_8_ = 0;
        auVar37._8_8_ = 0;
        auVar37._0_8_ = *(ulong *)(in_RDI + 8);
        auVar448._8_8_ = 0;
        auVar448._0_8_ = -dVar10;
        auVar24 = vfmadd213sd_fma(auVar37,auVar388,auVar448);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = (auVar24._0_8_ - in_stack_00000008) - in_stack_00000030;
        auVar23 = vfmadd213sd_fma(auVar38,auVar134,auVar23);
        auVar43._0_8_ = auVar23._0_8_;
        auVar135._0_8_ = (double)local_1a4;
        uVar118 = auVar23._8_8_;
        auVar135._8_8_ = uVar118;
        auVar39._8_8_ = 0;
        auVar39._0_8_ = *(ulong *)(in_RDI + 4);
        auVar280._8_8_ = 0;
        auVar280._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
        auVar23 = vfmadd213sd_fma(auVar39,auVar135,auVar280);
        auVar281._0_8_ = (double)local_1a4;
        auVar281._8_8_ = uVar118;
        auVar136._8_8_ = 0;
        auVar136._0_8_ = *(ulong *)(in_RDI + 4);
        auVar389._8_8_ = 0;
        auVar389._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
        auVar24 = vfmadd213sd_fma(auVar136,auVar281,auVar389);
        auVar390._0_8_ = (double)local_1a8;
        auVar390._8_8_ = uVar118;
        auVar282._8_8_ = 0;
        auVar282._0_8_ = *(ulong *)(in_RDI + 6);
        auVar449._8_8_ = 0;
        auVar449._0_8_ = -dVar9;
        auVar119 = vfmadd213sd_fma(auVar282,auVar390,auVar449);
        auVar450._0_8_ = (double)local_1a8;
        auVar450._8_8_ = uVar118;
        auVar391._8_8_ = 0;
        auVar391._0_8_ = *(ulong *)(in_RDI + 6);
        auVar486._8_8_ = 0;
        auVar486._0_8_ = -dVar9;
        auVar120 = vfmadd213sd_fma(auVar391,auVar450,auVar486);
        auVar40._8_8_ = 0;
        auVar40._0_8_ = auVar23._0_8_ - in_stack_00000020;
        auVar137._8_8_ = 0;
        auVar137._0_8_ = auVar24._0_8_ - in_stack_00000020;
        auVar283._8_8_ = 0;
        auVar283._0_8_ =
             ((auVar119._0_8_ - in_XMM7_Qa) - in_stack_00000028) *
             ((auVar120._0_8_ - in_XMM7_Qa) - in_stack_00000028);
        auVar23 = vfmadd213sd_fma(auVar137,auVar40,auVar283);
        auVar284._0_8_ = (double)local_1ac;
        auVar284._8_8_ = 0;
        auVar41._8_8_ = 0;
        auVar41._0_8_ = *(ulong *)(in_RDI + 8);
        auVar392._8_8_ = 0;
        auVar392._0_8_ = -dVar10;
        auVar24 = vfmadd213sd_fma(auVar41,auVar284,auVar392);
        auVar393._0_8_ = (double)local_1ac;
        auVar393._8_8_ = 0;
        auVar285._8_8_ = 0;
        auVar285._0_8_ = *(ulong *)(in_RDI + 8);
        auVar451._8_8_ = 0;
        auVar451._0_8_ = -dVar10;
        auVar119 = vfmadd213sd_fma(auVar285,auVar393,auVar451);
        auVar42._8_8_ = 0;
        auVar42._0_8_ = (auVar24._0_8_ - in_stack_00000008) - in_stack_00000030;
        auVar286._8_8_ = 0;
        auVar286._0_8_ = (auVar119._0_8_ - in_stack_00000008) - in_stack_00000030;
        auVar23 = vfmadd213sd_fma(auVar286,auVar42,auVar23);
        auVar43._8_8_ = 0;
        auVar138._8_8_ = 0;
        auVar138._0_8_ = -auVar43._0_8_;
        auVar23 = vfmadd213sd_fma(auVar43,auVar138,auVar23);
        dVar13 = sqrt(auVar23._0_8_);
        auVar287._8_8_ = 0;
        auVar287._0_8_ = auVar43._0_8_ - local_38;
        auVar394._8_8_ = 0;
        auVar394._0_8_ = auVar43._0_8_ - local_38;
        auVar452._8_8_ = 0;
        auVar452._0_8_ = dVar3 * dVar3;
        auVar23 = vfmadd213sd_fma(auVar287,auVar394,auVar452);
        dVar14 = atan((auVar43._0_8_ - local_38) / dVar3);
        dVar15 = atan(local_38 / dVar3);
        dVar15 = ((auVar43._0_8_ +
                  (((dVar13 * dVar13) / 2.0) * (auVar43._0_8_ - local_38)) / auVar23._0_8_) - dVar14
                 ) - dVar15;
        dVar14 = atan(local_38 / dVar3);
        dVar16 = atan(local_38 / dVar3);
        dVar14 = sqrt((((dVar15 - local_38) + dVar14) * ((dVar15 - local_38) + dVar16)) /
                      (dVar3 * dVar3) + 1.0);
        dVar14 = dVar8 * dVar14;
        dVar16 = ((((in_XMM3_Qa * dVar4) / 2.0) / dVar7) / dVar14) * (dVar5 / dVar6);
        auVar265 = ZEXT864((ulong)-local_80);
        iVar515 = (int)((ulong)in_stack_fffffffffffff9b8 >> 0x20);
        if (((dVar15 <= -local_80) || (auVar265 = ZEXT864((ulong)dVar15), local_80 <= dVar15)) ||
           (auVar265 = ZEXT864((ulong)dVar13), dVar14 <= dVar13)) {
          if ((in_DL & 1) == 0) {
            pppcVar1 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar1)[local_1a8][local_1ac].ex = 0.0;
            pppcVar1 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar1)[local_1a8][local_1ac].ey = 0.0;
            pppcVar1 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar1)[local_1a8][local_1ac].ez = 0.0;
            pppcVar2 = field3d<cellb>::operator[](in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar2)[local_1a8][local_1ac].bx = 0.0;
            pppcVar2 = field3d<cellb>::operator[](in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar2)[local_1a8][local_1ac].by = 0.0;
            pppcVar2 = field3d<cellb>::operator[](in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar2)[local_1a8][local_1ac].bz = 0.0;
          }
        }
        else {
          if (in_ECX == 1) {
            auVar45._0_8_ =
                 cos(((dVar15 * 3.141592653589793 * dVar15 * dVar15 * dVar15) / 2.0) /
                     (local_80 * local_80 * local_80 * local_80));
            dVar17 = cos(((dVar13 * 3.141592653589793) / 2.0) / dVar14);
            dVar18 = sin(((dVar15 * 3.141592653589793 * dVar15 * dVar15 * dVar15) / 2.0) /
                         (local_80 * local_80 * local_80 * local_80));
            dVar19 = sin(((dVar13 * 3.141592653589793) / 2.0) / dVar14);
            auVar139._8_8_ = 0;
            auVar139._0_8_ = in_stack_00000018;
            auVar44._8_8_ = 0;
            auVar44._0_8_ = dVar15;
            auVar288._8_8_ = 0;
            auVar288._0_8_ = in_XMM6_Qa;
            auVar23 = vfmadd213sd_fma(auVar44,auVar139,auVar288);
            dVar22 = auVar23._0_8_;
            dVar20 = cos(dVar22);
            dVar21 = sin(dVar22);
            auVar140._8_8_ = 0;
            auVar140._0_8_ = auVar45._0_8_;
            auVar289._8_8_ = 0;
            auVar289._0_8_ = in_stack_00000018 * dVar20 * auVar45._0_8_;
            auVar395._8_8_ = 0;
            auVar395._0_8_ =
                 -(((dVar15 * 12.566370614359172 * dVar15 * dVar15) /
                   (local_80 * local_80 * local_80 * local_80)) * dVar21 * auVar45._0_8_ * dVar18);
            auVar23 = vfmadd213sd_fma(auVar140,auVar289,auVar395);
            local_180 = ((dVar16 * in_XMM0_Qa * dVar17 * dVar17) / in_stack_00000018) *
                        auVar23._0_8_;
            dVar20 = sin(dVar22);
            dVar21 = cos(dVar22);
            auVar141._8_8_ = 0;
            auVar141._0_8_ = auVar45._0_8_;
            auVar290._8_8_ = 0;
            auVar290._0_8_ = in_stack_00000018 * dVar20 * auVar45._0_8_;
            auVar396._8_8_ = 0;
            auVar396._0_8_ =
                 ((dVar15 * 12.566370614359172 * dVar15 * dVar15) /
                 (local_80 * local_80 * local_80 * local_80)) * dVar21 * auVar45._0_8_ * dVar18;
            auVar23 = vfmadd213sd_fma(auVar141,auVar290,auVar396);
            local_188 = ((-dVar16 * in_XMM1_Qa * dVar17 * dVar17) / in_stack_00000018) *
                        auVar23._0_8_;
            local_198 = -local_188;
            if ((dVar13 != 0.0) || (NAN(dVar13))) {
              auVar291._0_8_ = (double)local_1a4;
              auVar291._8_8_ = 0;
              auVar142._8_8_ = 0;
              auVar142._0_8_ = *(ulong *)(in_RDI + 4);
              auVar397._8_8_ = 0;
              auVar397._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar23 = vfmadd213sd_fma(auVar142,auVar291,auVar397);
              auVar398._8_8_ = 0;
              auVar398._0_8_ = local_c0;
              auVar453._0_8_ = (double)local_1a8;
              auVar453._8_8_ = 0;
              auVar292._8_8_ = 0;
              auVar292._0_8_ = *(ulong *)(in_RDI + 6);
              auVar487._8_8_ = 0;
              auVar487._0_8_ = -dVar9;
              auVar24 = vfmadd213sd_fma(auVar292,auVar453,auVar487);
              auVar143._8_8_ = 0;
              auVar143._0_8_ = auVar23._0_8_ - in_stack_00000020;
              auVar293._8_8_ = 0;
              auVar293._0_8_ = ((auVar24._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_c8;
              auVar23 = vfmadd213sd_fma(auVar398,auVar143,auVar293);
              auVar294._0_8_ = (double)local_1ac;
              auVar294._8_8_ = 0;
              auVar144._8_8_ = 0;
              auVar144._0_8_ = *(ulong *)(in_RDI + 8);
              auVar454._8_8_ = 0;
              auVar454._0_8_ = -dVar10;
              auVar24 = vfmadd213sd_fma(auVar144,auVar294,auVar454);
              auVar145._8_8_ = 0;
              auVar145._0_8_ = local_d0;
              auVar295._8_8_ = 0;
              auVar295._0_8_ = (auVar24._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar23 = vfmadd213sd_fma(auVar145,auVar295,auVar23);
              dVar20 = sin(dVar22);
              dVar21 = cos(dVar22);
              auVar146._8_8_ = 0;
              auVar146._0_8_ = in_stack_00000018 * dVar20 * auVar45._0_8_;
              auVar45._8_8_ = 0;
              auVar296._8_8_ = 0;
              auVar296._0_8_ =
                   ((dVar15 * 12.566370614359172 * dVar15 * dVar15) /
                   (local_80 * local_80 * local_80 * local_80)) * dVar21 * auVar45._0_8_ * dVar18;
              auVar24 = vfmadd213sd_fma(auVar45,auVar146,auVar296);
              auVar50._0_8_ = auVar24._0_8_;
              auVar147._0_8_ = (double)local_1a4;
              auVar147._8_8_ = auVar24._8_8_;
              auVar46._8_8_ = 0;
              auVar46._0_8_ = *(ulong *)(in_RDI + 4);
              auVar297._8_8_ = 0;
              auVar297._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar119 = vfmadd213sd_fma(auVar46,auVar147,auVar297);
              auVar298._8_8_ = 0;
              auVar298._0_8_ = local_c0;
              auVar399._0_8_ = (double)local_1a8;
              auVar399._8_8_ = auVar24._8_8_;
              auVar148._8_8_ = 0;
              auVar148._0_8_ = *(ulong *)(in_RDI + 6);
              auVar455._8_8_ = 0;
              auVar455._0_8_ = -dVar9;
              auVar24 = vfmadd213sd_fma(auVar148,auVar399,auVar455);
              auVar47._8_8_ = 0;
              auVar47._0_8_ = auVar119._0_8_ - in_stack_00000020;
              auVar149._8_8_ = 0;
              auVar149._0_8_ = ((auVar24._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_c8;
              auVar24 = vfmadd213sd_fma(auVar298,auVar47,auVar149);
              auVar150._0_8_ = (double)local_1ac;
              auVar150._8_8_ = 0;
              auVar48._8_8_ = 0;
              auVar48._0_8_ = *(ulong *)(in_RDI + 8);
              auVar400._8_8_ = 0;
              auVar400._0_8_ = -dVar10;
              auVar119 = vfmadd213sd_fma(auVar48,auVar150,auVar400);
              auVar49._8_8_ = 0;
              auVar49._0_8_ = local_d0;
              auVar151._8_8_ = 0;
              auVar151._0_8_ = (auVar119._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar24 = vfmadd213sd_fma(auVar49,auVar151,auVar24);
              auVar152._8_8_ = 0;
              auVar152._0_8_ = auVar43._0_8_ - local_38;
              auVar299._8_8_ = 0;
              auVar299._0_8_ = auVar43._0_8_ - local_38;
              auVar401._8_8_ = 0;
              auVar401._0_8_ = dVar3 * dVar3;
              auVar119 = vfmadd213sd_fma(auVar152,auVar299,auVar401);
              dVar20 = cos(dVar22);
              dVar21 = sin(dVar22);
              auVar402._8_8_ = 0;
              auVar402._0_8_ = -in_stack_00000018 * dVar20;
              auVar456._8_8_ = 0;
              auVar456._0_8_ = auVar45._0_8_ * auVar45._0_8_;
              auVar153._8_8_ = 0;
              auVar153._0_8_ =
                   (((dVar17 * dVar19 * 3.141592653589793) / dVar14) * auVar23._0_8_) / dVar13;
              auVar50._8_8_ = 0;
              auVar488._8_8_ = 0;
              auVar488._0_8_ =
                   ((dVar15 * 12.566370614359172 * dVar15 * dVar15) /
                   (local_80 * local_80 * local_80 * local_80)) * auVar45._0_8_ * dVar18 * dVar21;
              auVar23 = vfmadd213sd_fma(auVar402,auVar456,auVar488);
              auVar300._8_8_ = 0;
              auVar300._0_8_ =
                   ((auVar24._0_8_ * (auVar43._0_8_ - local_38)) / auVar119._0_8_) * dVar17 * dVar17
                   * auVar23._0_8_;
              auVar23 = vfmadd213sd_fma(auVar50,auVar153,auVar300);
              auVar56._0_8_ = auVar23._0_8_;
              auVar301._0_8_ = (double)local_1a4;
              auVar301._8_8_ = 0;
              auVar154._8_8_ = 0;
              auVar154._0_8_ = *(ulong *)(in_RDI + 4);
              auVar403._8_8_ = 0;
              auVar403._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar23 = vfmadd213sd_fma(auVar154,auVar301,auVar403);
              auVar404._8_8_ = 0;
              auVar404._0_8_ = local_d8;
              auVar457._0_8_ = (double)local_1a8;
              auVar457._8_8_ = 0;
              auVar302._8_8_ = 0;
              auVar302._0_8_ = *(ulong *)(in_RDI + 6);
              auVar489._8_8_ = 0;
              auVar489._0_8_ = -dVar9;
              auVar24 = vfmadd213sd_fma(auVar302,auVar457,auVar489);
              auVar155._8_8_ = 0;
              auVar155._0_8_ = auVar23._0_8_ - in_stack_00000020;
              auVar303._8_8_ = 0;
              auVar303._0_8_ = ((auVar24._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_e0;
              auVar23 = vfmadd213sd_fma(auVar404,auVar155,auVar303);
              auVar304._0_8_ = (double)local_1ac;
              auVar304._8_8_ = 0;
              auVar156._8_8_ = 0;
              auVar156._0_8_ = *(ulong *)(in_RDI + 8);
              auVar458._8_8_ = 0;
              auVar458._0_8_ = -dVar10;
              auVar24 = vfmadd213sd_fma(auVar156,auVar304,auVar458);
              auVar157._8_8_ = 0;
              auVar157._0_8_ = local_e8;
              auVar305._8_8_ = 0;
              auVar305._0_8_ = (auVar24._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar23 = vfmadd213sd_fma(auVar157,auVar305,auVar23);
              dVar20 = cos(dVar22);
              dVar21 = sin(dVar22);
              auVar158._8_8_ = 0;
              auVar158._0_8_ = -in_stack_00000018 * dVar20 * auVar45._0_8_;
              auVar51._8_8_ = 0;
              auVar51._0_8_ = auVar45._0_8_;
              auVar306._8_8_ = 0;
              auVar306._0_8_ =
                   -(((dVar15 * 12.566370614359172 * dVar15 * dVar15) /
                     (local_80 * local_80 * local_80 * local_80)) * dVar21 * auVar45._0_8_ * dVar18)
              ;
              auVar24 = vfmadd213sd_fma(auVar51,auVar158,auVar306);
              auVar159._0_8_ = (double)local_1a4;
              auVar159._8_8_ = auVar24._8_8_;
              auVar52._8_8_ = 0;
              auVar52._0_8_ = *(ulong *)(in_RDI + 4);
              auVar307._8_8_ = 0;
              auVar307._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar119 = vfmadd213sd_fma(auVar52,auVar159,auVar307);
              auVar308._8_8_ = 0;
              auVar308._0_8_ = local_d8;
              auVar405._0_8_ = (double)local_1a8;
              auVar405._8_8_ = auVar24._8_8_;
              auVar160._8_8_ = 0;
              auVar160._0_8_ = *(ulong *)(in_RDI + 6);
              auVar459._8_8_ = 0;
              auVar459._0_8_ = -dVar9;
              auVar120 = vfmadd213sd_fma(auVar160,auVar405,auVar459);
              auVar53._8_8_ = 0;
              auVar53._0_8_ = auVar119._0_8_ - in_stack_00000020;
              auVar161._8_8_ = 0;
              auVar161._0_8_ = ((auVar120._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_e0;
              auVar119 = vfmadd213sd_fma(auVar308,auVar53,auVar161);
              auVar162._0_8_ = (double)local_1ac;
              auVar162._8_8_ = 0;
              auVar54._8_8_ = 0;
              auVar54._0_8_ = *(ulong *)(in_RDI + 8);
              auVar406._8_8_ = 0;
              auVar406._0_8_ = -dVar10;
              auVar120 = vfmadd213sd_fma(auVar54,auVar162,auVar406);
              auVar55._8_8_ = 0;
              auVar55._0_8_ = local_e8;
              auVar163._8_8_ = 0;
              auVar163._0_8_ = (auVar120._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar119 = vfmadd213sd_fma(auVar55,auVar163,auVar119);
              auVar164._8_8_ = 0;
              auVar164._0_8_ = auVar43._0_8_ - local_38;
              auVar309._8_8_ = 0;
              auVar309._0_8_ = auVar43._0_8_ - local_38;
              auVar407._8_8_ = 0;
              auVar407._0_8_ = dVar3 * dVar3;
              auVar120 = vfmadd213sd_fma(auVar164,auVar309,auVar407);
              dVar20 = sin(dVar22);
              dVar21 = cos(dVar22);
              auVar503._8_8_ = 0;
              auVar503._0_8_ = -in_stack_00000018 * dVar20;
              auVar507._8_8_ = 0;
              auVar507._0_8_ = auVar45._0_8_ * auVar45._0_8_;
              auVar408._8_8_ = 0;
              auVar408._0_8_ = auVar24._0_8_;
              auVar460._8_8_ = 0;
              auVar460._0_8_ =
                   (((dVar17 * dVar19 * 3.141592653589793) / dVar14) * auVar23._0_8_) / dVar13;
              auVar165._8_8_ = 0;
              auVar165._0_8_ = (dVar16 * in_XMM0_Qa) / in_stack_00000018;
              auVar56._8_8_ = 0;
              auVar511._8_8_ = 0;
              auVar511._0_8_ =
                   -(((dVar15 * 12.566370614359172 * dVar15 * dVar15) /
                     (local_80 * local_80 * local_80 * local_80)) * auVar45._0_8_ * dVar18 * dVar21)
              ;
              auVar23 = vfmadd213sd_fma(auVar503,auVar507,auVar511);
              auVar490._8_8_ = 0;
              auVar490._0_8_ =
                   ((auVar119._0_8_ * (auVar43._0_8_ - local_38)) / auVar120._0_8_) * dVar17 *
                   dVar17 * auVar23._0_8_;
              auVar23 = vfmadd213sd_fma(auVar408,auVar460,auVar490);
              auVar310._8_8_ = 0;
              auVar310._0_8_ = -(((dVar16 * in_XMM1_Qa) / in_stack_00000018) * auVar23._0_8_);
              auVar23 = vfmadd213sd_fma(auVar56,auVar165,auVar310);
              local_178 = auVar23._0_8_;
            }
            else {
              local_178 = 0;
            }
            if ((dVar13 != 0.0) || (NAN(dVar13))) {
              auVar311._0_8_ = (double)local_1a4;
              auVar311._8_8_ = 0;
              auVar166._8_8_ = 0;
              auVar166._0_8_ = *(ulong *)(in_RDI + 4);
              auVar409._8_8_ = 0;
              auVar409._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar23 = vfmadd213sd_fma(auVar166,auVar311,auVar409);
              auVar410._8_8_ = 0;
              auVar410._0_8_ = local_d8;
              auVar461._0_8_ = (double)local_1a8;
              auVar461._8_8_ = 0;
              auVar312._8_8_ = 0;
              auVar312._0_8_ = *(ulong *)(in_RDI + 6);
              auVar491._8_8_ = 0;
              auVar491._0_8_ = -dVar9;
              auVar24 = vfmadd213sd_fma(auVar312,auVar461,auVar491);
              auVar167._8_8_ = 0;
              auVar167._0_8_ = auVar23._0_8_ - in_stack_00000020;
              auVar313._8_8_ = 0;
              auVar313._0_8_ = ((auVar24._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_e0;
              auVar23 = vfmadd213sd_fma(auVar410,auVar167,auVar313);
              auVar314._0_8_ = (double)local_1ac;
              auVar314._8_8_ = 0;
              auVar168._8_8_ = 0;
              auVar168._0_8_ = *(ulong *)(in_RDI + 8);
              auVar462._8_8_ = 0;
              auVar462._0_8_ = -dVar10;
              auVar24 = vfmadd213sd_fma(auVar168,auVar314,auVar462);
              auVar169._8_8_ = 0;
              auVar169._0_8_ = local_e8;
              auVar315._8_8_ = 0;
              auVar315._0_8_ = (auVar24._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar23 = vfmadd213sd_fma(auVar169,auVar315,auVar23);
              dVar20 = sin(dVar22);
              dVar21 = cos(dVar22);
              auVar170._8_8_ = 0;
              auVar170._0_8_ = in_stack_00000018 * dVar20 * auVar45._0_8_;
              auVar57._8_8_ = 0;
              auVar57._0_8_ = auVar45._0_8_;
              auVar316._8_8_ = 0;
              auVar316._0_8_ =
                   ((dVar15 * 12.566370614359172 * dVar15 * dVar15) /
                   (local_80 * local_80 * local_80 * local_80)) * dVar21 * auVar45._0_8_ * dVar18;
              auVar24 = vfmadd213sd_fma(auVar57,auVar170,auVar316);
              auVar62._0_8_ = auVar24._0_8_;
              auVar171._0_8_ = (double)local_1a4;
              auVar171._8_8_ = auVar24._8_8_;
              auVar58._8_8_ = 0;
              auVar58._0_8_ = *(ulong *)(in_RDI + 4);
              auVar317._8_8_ = 0;
              auVar317._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar119 = vfmadd213sd_fma(auVar58,auVar171,auVar317);
              auVar318._8_8_ = 0;
              auVar318._0_8_ = local_d8;
              auVar411._0_8_ = (double)local_1a8;
              auVar411._8_8_ = auVar24._8_8_;
              auVar172._8_8_ = 0;
              auVar172._0_8_ = *(ulong *)(in_RDI + 6);
              auVar463._8_8_ = 0;
              auVar463._0_8_ = -dVar9;
              auVar24 = vfmadd213sd_fma(auVar172,auVar411,auVar463);
              auVar59._8_8_ = 0;
              auVar59._0_8_ = auVar119._0_8_ - in_stack_00000020;
              auVar173._8_8_ = 0;
              auVar173._0_8_ = ((auVar24._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_e0;
              auVar24 = vfmadd213sd_fma(auVar318,auVar59,auVar173);
              auVar174._0_8_ = (double)local_1ac;
              auVar174._8_8_ = 0;
              auVar60._8_8_ = 0;
              auVar60._0_8_ = *(ulong *)(in_RDI + 8);
              auVar412._8_8_ = 0;
              auVar412._0_8_ = -dVar10;
              auVar119 = vfmadd213sd_fma(auVar60,auVar174,auVar412);
              auVar61._8_8_ = 0;
              auVar61._0_8_ = local_e8;
              auVar175._8_8_ = 0;
              auVar175._0_8_ = (auVar119._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar24 = vfmadd213sd_fma(auVar61,auVar175,auVar24);
              auVar176._8_8_ = 0;
              auVar176._0_8_ = auVar43._0_8_ - local_38;
              auVar319._8_8_ = 0;
              auVar319._0_8_ = auVar43._0_8_ - local_38;
              auVar413._8_8_ = 0;
              auVar413._0_8_ = dVar3 * dVar3;
              auVar119 = vfmadd213sd_fma(auVar176,auVar319,auVar413);
              dVar20 = cos(dVar22);
              dVar21 = sin(dVar22);
              auVar414._8_8_ = 0;
              auVar414._0_8_ = -in_stack_00000018 * dVar20;
              auVar464._8_8_ = 0;
              auVar464._0_8_ = auVar45._0_8_ * auVar45._0_8_;
              auVar177._8_8_ = 0;
              auVar177._0_8_ =
                   (((dVar17 * dVar19 * 3.141592653589793) / dVar14) * auVar23._0_8_) / dVar13;
              auVar62._8_8_ = 0;
              auVar492._8_8_ = 0;
              auVar492._0_8_ =
                   ((dVar15 * 12.566370614359172 * dVar15 * dVar15) /
                   (local_80 * local_80 * local_80 * local_80)) * auVar45._0_8_ * dVar18 * dVar21;
              auVar23 = vfmadd213sd_fma(auVar414,auVar464,auVar492);
              auVar320._8_8_ = 0;
              auVar320._0_8_ =
                   ((auVar24._0_8_ * (auVar43._0_8_ - local_38)) / auVar119._0_8_) * dVar17 * dVar17
                   * auVar23._0_8_;
              auVar23 = vfmadd213sd_fma(auVar62,auVar177,auVar320);
              auVar68._0_8_ = auVar23._0_8_;
              auVar321._0_8_ = (double)local_1a4;
              auVar321._8_8_ = 0;
              auVar178._8_8_ = 0;
              auVar178._0_8_ = *(ulong *)(in_RDI + 4);
              auVar415._8_8_ = 0;
              auVar415._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar23 = vfmadd213sd_fma(auVar178,auVar321,auVar415);
              auVar416._8_8_ = 0;
              auVar416._0_8_ = local_c0;
              auVar465._0_8_ = (double)local_1a8;
              auVar465._8_8_ = 0;
              auVar322._8_8_ = 0;
              auVar322._0_8_ = *(ulong *)(in_RDI + 6);
              auVar493._8_8_ = 0;
              auVar493._0_8_ = -dVar9;
              auVar24 = vfmadd213sd_fma(auVar322,auVar465,auVar493);
              auVar179._8_8_ = 0;
              auVar179._0_8_ = auVar23._0_8_ - in_stack_00000020;
              auVar323._8_8_ = 0;
              auVar323._0_8_ = ((auVar24._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_c8;
              auVar23 = vfmadd213sd_fma(auVar416,auVar179,auVar323);
              auVar324._0_8_ = (double)local_1ac;
              auVar324._8_8_ = 0;
              auVar180._8_8_ = 0;
              auVar180._0_8_ = *(ulong *)(in_RDI + 8);
              auVar466._8_8_ = 0;
              auVar466._0_8_ = -dVar10;
              auVar24 = vfmadd213sd_fma(auVar180,auVar324,auVar466);
              auVar181._8_8_ = 0;
              auVar181._0_8_ = local_d0;
              auVar325._8_8_ = 0;
              auVar325._0_8_ = (auVar24._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar23 = vfmadd213sd_fma(auVar181,auVar325,auVar23);
              dVar20 = cos(dVar22);
              dVar21 = sin(dVar22);
              auVar182._8_8_ = 0;
              auVar182._0_8_ = -in_stack_00000018 * dVar20 * auVar45._0_8_;
              auVar63._8_8_ = 0;
              auVar63._0_8_ = auVar45._0_8_;
              auVar326._8_8_ = 0;
              auVar326._0_8_ =
                   -(((dVar15 * 12.566370614359172 * dVar15 * dVar15) /
                     (local_80 * local_80 * local_80 * local_80)) * dVar21 * auVar45._0_8_ * dVar18)
              ;
              auVar24 = vfmadd213sd_fma(auVar63,auVar182,auVar326);
              auVar183._0_8_ = (double)local_1a4;
              auVar183._8_8_ = auVar24._8_8_;
              auVar64._8_8_ = 0;
              auVar64._0_8_ = *(ulong *)(in_RDI + 4);
              auVar327._8_8_ = 0;
              auVar327._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar119 = vfmadd213sd_fma(auVar64,auVar183,auVar327);
              auVar328._8_8_ = 0;
              auVar328._0_8_ = local_c0;
              auVar417._0_8_ = (double)local_1a8;
              auVar417._8_8_ = auVar24._8_8_;
              auVar184._8_8_ = 0;
              auVar184._0_8_ = *(ulong *)(in_RDI + 6);
              auVar467._8_8_ = 0;
              auVar467._0_8_ = -dVar9;
              auVar120 = vfmadd213sd_fma(auVar184,auVar417,auVar467);
              auVar65._8_8_ = 0;
              auVar65._0_8_ = auVar119._0_8_ - in_stack_00000020;
              auVar185._8_8_ = 0;
              auVar185._0_8_ = ((auVar120._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_c8;
              auVar119 = vfmadd213sd_fma(auVar328,auVar65,auVar185);
              auVar186._0_8_ = (double)local_1ac;
              auVar186._8_8_ = 0;
              auVar66._8_8_ = 0;
              auVar66._0_8_ = *(ulong *)(in_RDI + 8);
              auVar418._8_8_ = 0;
              auVar418._0_8_ = -dVar10;
              auVar120 = vfmadd213sd_fma(auVar66,auVar186,auVar418);
              auVar67._8_8_ = 0;
              auVar67._0_8_ = local_d0;
              auVar187._8_8_ = 0;
              auVar187._0_8_ = (auVar120._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar119 = vfmadd213sd_fma(auVar67,auVar187,auVar119);
              auVar188._8_8_ = 0;
              auVar188._0_8_ = auVar43._0_8_ - local_38;
              auVar329._8_8_ = 0;
              auVar329._0_8_ = auVar43._0_8_ - local_38;
              auVar419._8_8_ = 0;
              auVar419._0_8_ = dVar3 * dVar3;
              auVar120 = vfmadd213sd_fma(auVar188,auVar329,auVar419);
              dVar20 = sin(dVar22);
              dVar22 = cos(dVar22);
              auVar504._8_8_ = 0;
              auVar504._0_8_ = -in_stack_00000018 * dVar20;
              auVar508._8_8_ = 0;
              auVar508._0_8_ = auVar45._0_8_ * auVar45._0_8_;
              auVar420._8_8_ = 0;
              auVar420._0_8_ = auVar24._0_8_;
              auVar468._8_8_ = 0;
              auVar468._0_8_ =
                   (((dVar17 * dVar19 * 3.141592653589793) / dVar14) * auVar23._0_8_) / dVar13;
              auVar189._8_8_ = 0;
              auVar189._0_8_ = (dVar16 * in_XMM0_Qa) / in_stack_00000018;
              auVar68._8_8_ = 0;
              auVar512._8_8_ = 0;
              auVar512._0_8_ =
                   -(((dVar15 * 12.566370614359172 * dVar15 * dVar15) /
                     (local_80 * local_80 * local_80 * local_80)) * auVar45._0_8_ * dVar18 * dVar22)
              ;
              auVar23 = vfmadd213sd_fma(auVar504,auVar508,auVar512);
              auVar494._8_8_ = 0;
              auVar494._0_8_ =
                   ((auVar119._0_8_ * (auVar43._0_8_ - local_38)) / auVar120._0_8_) * dVar17 *
                   dVar17 * auVar23._0_8_;
              auVar23 = vfmadd213sd_fma(auVar420,auVar468,auVar494);
              auVar330._8_8_ = 0;
              auVar330._0_8_ = ((dVar16 * in_XMM1_Qa) / in_stack_00000018) * auVar23._0_8_;
              auVar23 = vfmadd213sd_fma(auVar68,auVar189,auVar330);
              local_190 = auVar23._0_8_;
            }
            else {
              local_190 = 0;
            }
          }
          else if ((dVar13 < (dVar8 * -2.0 * (local_38 - auVar43._0_8_)) / dVar3) ||
                  ((dVar8 * 2.0 * (local_38 - auVar43._0_8_)) / dVar3 < dVar13)) {
            local_178 = 0;
            local_180 = 0.0;
            local_188 = 0.0;
            local_190 = 0;
            local_198 = 0.0;
          }
          else {
            auVar70._0_8_ = cos(((dVar15 * 3.141592653589793) / 2.0) / local_80);
            dVar17 = cos(((dVar13 * 3.141592653589793) / 2.0) / dVar14);
            dVar18 = sin(((dVar15 * 3.141592653589793) / 2.0) / local_80);
            dVar19 = sin(((dVar13 * 3.141592653589793) / 2.0) / dVar14);
            auVar190._8_8_ = 0;
            auVar190._0_8_ = in_stack_00000018;
            auVar69._8_8_ = 0;
            auVar69._0_8_ = dVar15;
            auVar331._8_8_ = 0;
            auVar331._0_8_ = in_XMM6_Qa;
            auVar23 = vfmadd213sd_fma(auVar69,auVar190,auVar331);
            dVar15 = auVar23._0_8_;
            dVar22 = cos(dVar15);
            dVar20 = sin(dVar15);
            auVar191._8_8_ = 0;
            auVar191._0_8_ = auVar70._0_8_;
            auVar332._8_8_ = 0;
            auVar332._0_8_ = in_stack_00000018 * dVar22 * auVar70._0_8_;
            auVar421._8_8_ = 0;
            auVar421._0_8_ = -((3.141592653589793 / local_80) * dVar20 * auVar70._0_8_ * dVar18);
            auVar23 = vfmadd213sd_fma(auVar191,auVar332,auVar421);
            local_180 = ((dVar16 * in_XMM0_Qa * dVar17 * dVar17) / in_stack_00000018) *
                        auVar23._0_8_;
            dVar22 = sin(dVar15);
            dVar20 = cos(dVar15);
            auVar192._8_8_ = 0;
            auVar192._0_8_ = auVar70._0_8_;
            auVar333._8_8_ = 0;
            auVar333._0_8_ = in_stack_00000018 * dVar22 * auVar70._0_8_;
            auVar422._8_8_ = 0;
            auVar422._0_8_ = (3.141592653589793 / local_80) * dVar20 * auVar70._0_8_ * dVar18;
            auVar23 = vfmadd213sd_fma(auVar192,auVar333,auVar422);
            local_188 = ((-dVar16 * in_XMM1_Qa * dVar17 * dVar17) / in_stack_00000018) *
                        auVar23._0_8_;
            local_198 = -local_188;
            if ((dVar13 != 0.0) || (NAN(dVar13))) {
              auVar334._0_8_ = (double)local_1a4;
              auVar334._8_8_ = 0;
              auVar193._8_8_ = 0;
              auVar193._0_8_ = *(ulong *)(in_RDI + 4);
              auVar423._8_8_ = 0;
              auVar423._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar23 = vfmadd213sd_fma(auVar193,auVar334,auVar423);
              auVar424._8_8_ = 0;
              auVar424._0_8_ = local_c0;
              auVar469._0_8_ = (double)local_1a8;
              auVar469._8_8_ = 0;
              auVar335._8_8_ = 0;
              auVar335._0_8_ = *(ulong *)(in_RDI + 6);
              auVar495._8_8_ = 0;
              auVar495._0_8_ = -dVar9;
              auVar24 = vfmadd213sd_fma(auVar335,auVar469,auVar495);
              auVar194._8_8_ = 0;
              auVar194._0_8_ = auVar23._0_8_ - in_stack_00000020;
              auVar336._8_8_ = 0;
              auVar336._0_8_ = ((auVar24._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_c8;
              auVar23 = vfmadd213sd_fma(auVar424,auVar194,auVar336);
              auVar337._0_8_ = (double)local_1ac;
              auVar337._8_8_ = 0;
              auVar195._8_8_ = 0;
              auVar195._0_8_ = *(ulong *)(in_RDI + 8);
              auVar470._8_8_ = 0;
              auVar470._0_8_ = -dVar10;
              auVar24 = vfmadd213sd_fma(auVar195,auVar337,auVar470);
              auVar196._8_8_ = 0;
              auVar196._0_8_ = local_d0;
              auVar338._8_8_ = 0;
              auVar338._0_8_ = (auVar24._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar23 = vfmadd213sd_fma(auVar196,auVar338,auVar23);
              dVar22 = sin(dVar15);
              dVar20 = cos(dVar15);
              auVar197._8_8_ = 0;
              auVar197._0_8_ = in_stack_00000018 * dVar22 * auVar70._0_8_;
              auVar70._8_8_ = 0;
              auVar339._8_8_ = 0;
              auVar339._0_8_ = (3.141592653589793 / local_80) * dVar20 * auVar70._0_8_ * dVar18;
              auVar24 = vfmadd213sd_fma(auVar70,auVar197,auVar339);
              auVar75._0_8_ = auVar24._0_8_;
              auVar198._0_8_ = (double)local_1a4;
              auVar198._8_8_ = auVar24._8_8_;
              auVar71._8_8_ = 0;
              auVar71._0_8_ = *(ulong *)(in_RDI + 4);
              auVar340._8_8_ = 0;
              auVar340._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar119 = vfmadd213sd_fma(auVar71,auVar198,auVar340);
              auVar341._8_8_ = 0;
              auVar341._0_8_ = local_c0;
              auVar425._0_8_ = (double)local_1a8;
              auVar425._8_8_ = auVar24._8_8_;
              auVar199._8_8_ = 0;
              auVar199._0_8_ = *(ulong *)(in_RDI + 6);
              auVar471._8_8_ = 0;
              auVar471._0_8_ = -dVar9;
              auVar24 = vfmadd213sd_fma(auVar199,auVar425,auVar471);
              auVar72._8_8_ = 0;
              auVar72._0_8_ = auVar119._0_8_ - in_stack_00000020;
              auVar200._8_8_ = 0;
              auVar200._0_8_ = ((auVar24._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_c8;
              auVar24 = vfmadd213sd_fma(auVar341,auVar72,auVar200);
              auVar201._0_8_ = (double)local_1ac;
              auVar201._8_8_ = 0;
              auVar73._8_8_ = 0;
              auVar73._0_8_ = *(ulong *)(in_RDI + 8);
              auVar426._8_8_ = 0;
              auVar426._0_8_ = -dVar10;
              auVar119 = vfmadd213sd_fma(auVar73,auVar201,auVar426);
              auVar74._8_8_ = 0;
              auVar74._0_8_ = local_d0;
              auVar202._8_8_ = 0;
              auVar202._0_8_ = (auVar119._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar24 = vfmadd213sd_fma(auVar74,auVar202,auVar24);
              auVar203._8_8_ = 0;
              auVar203._0_8_ = auVar43._0_8_ - local_38;
              auVar342._8_8_ = 0;
              auVar342._0_8_ = auVar43._0_8_ - local_38;
              auVar427._8_8_ = 0;
              auVar427._0_8_ = dVar3 * dVar3;
              auVar119 = vfmadd213sd_fma(auVar203,auVar342,auVar427);
              dVar22 = cos(dVar15);
              dVar20 = sin(dVar15);
              auVar428._8_8_ = 0;
              auVar428._0_8_ = -in_stack_00000018 * dVar22;
              auVar472._8_8_ = 0;
              auVar472._0_8_ = auVar70._0_8_ * auVar70._0_8_;
              auVar204._8_8_ = 0;
              auVar204._0_8_ =
                   (((dVar17 * dVar19 * 3.141592653589793) / dVar14) * auVar23._0_8_) / dVar13;
              auVar75._8_8_ = 0;
              auVar496._8_8_ = 0;
              auVar496._0_8_ = (3.141592653589793 / local_80) * auVar70._0_8_ * dVar18 * dVar20;
              auVar23 = vfmadd213sd_fma(auVar428,auVar472,auVar496);
              auVar343._8_8_ = 0;
              auVar343._0_8_ =
                   ((auVar24._0_8_ * (auVar43._0_8_ - local_38)) / auVar119._0_8_) * dVar17 * dVar17
                   * auVar23._0_8_;
              auVar23 = vfmadd213sd_fma(auVar75,auVar204,auVar343);
              auVar81._0_8_ = auVar23._0_8_;
              auVar344._0_8_ = (double)local_1a4;
              auVar344._8_8_ = 0;
              auVar205._8_8_ = 0;
              auVar205._0_8_ = *(ulong *)(in_RDI + 4);
              auVar429._8_8_ = 0;
              auVar429._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar23 = vfmadd213sd_fma(auVar205,auVar344,auVar429);
              auVar430._8_8_ = 0;
              auVar430._0_8_ = local_d8;
              auVar473._0_8_ = (double)local_1a8;
              auVar473._8_8_ = 0;
              auVar345._8_8_ = 0;
              auVar345._0_8_ = *(ulong *)(in_RDI + 6);
              auVar497._8_8_ = 0;
              auVar497._0_8_ = -dVar9;
              auVar24 = vfmadd213sd_fma(auVar345,auVar473,auVar497);
              auVar206._8_8_ = 0;
              auVar206._0_8_ = auVar23._0_8_ - in_stack_00000020;
              auVar346._8_8_ = 0;
              auVar346._0_8_ = ((auVar24._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_e0;
              auVar23 = vfmadd213sd_fma(auVar430,auVar206,auVar346);
              auVar347._0_8_ = (double)local_1ac;
              auVar347._8_8_ = 0;
              auVar207._8_8_ = 0;
              auVar207._0_8_ = *(ulong *)(in_RDI + 8);
              auVar474._8_8_ = 0;
              auVar474._0_8_ = -dVar10;
              auVar24 = vfmadd213sd_fma(auVar207,auVar347,auVar474);
              auVar208._8_8_ = 0;
              auVar208._0_8_ = local_e8;
              auVar348._8_8_ = 0;
              auVar348._0_8_ = (auVar24._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar23 = vfmadd213sd_fma(auVar208,auVar348,auVar23);
              dVar22 = cos(dVar15);
              dVar20 = sin(dVar15);
              auVar209._8_8_ = 0;
              auVar209._0_8_ = -in_stack_00000018 * dVar22 * auVar70._0_8_;
              auVar76._8_8_ = 0;
              auVar76._0_8_ = auVar70._0_8_;
              auVar349._8_8_ = 0;
              auVar349._0_8_ = -((3.141592653589793 / local_80) * dVar20 * auVar70._0_8_ * dVar18);
              auVar24 = vfmadd213sd_fma(auVar76,auVar209,auVar349);
              auVar210._0_8_ = (double)local_1a4;
              auVar210._8_8_ = auVar24._8_8_;
              auVar77._8_8_ = 0;
              auVar77._0_8_ = *(ulong *)(in_RDI + 4);
              auVar350._8_8_ = 0;
              auVar350._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar119 = vfmadd213sd_fma(auVar77,auVar210,auVar350);
              auVar351._8_8_ = 0;
              auVar351._0_8_ = local_d8;
              auVar431._0_8_ = (double)local_1a8;
              auVar431._8_8_ = auVar24._8_8_;
              auVar211._8_8_ = 0;
              auVar211._0_8_ = *(ulong *)(in_RDI + 6);
              auVar475._8_8_ = 0;
              auVar475._0_8_ = -dVar9;
              auVar120 = vfmadd213sd_fma(auVar211,auVar431,auVar475);
              auVar78._8_8_ = 0;
              auVar78._0_8_ = auVar119._0_8_ - in_stack_00000020;
              auVar212._8_8_ = 0;
              auVar212._0_8_ = ((auVar120._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_e0;
              auVar119 = vfmadd213sd_fma(auVar351,auVar78,auVar212);
              auVar213._0_8_ = (double)local_1ac;
              auVar213._8_8_ = 0;
              auVar79._8_8_ = 0;
              auVar79._0_8_ = *(ulong *)(in_RDI + 8);
              auVar432._8_8_ = 0;
              auVar432._0_8_ = -dVar10;
              auVar120 = vfmadd213sd_fma(auVar79,auVar213,auVar432);
              auVar80._8_8_ = 0;
              auVar80._0_8_ = local_e8;
              auVar214._8_8_ = 0;
              auVar214._0_8_ = (auVar120._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar119 = vfmadd213sd_fma(auVar80,auVar214,auVar119);
              auVar215._8_8_ = 0;
              auVar215._0_8_ = auVar43._0_8_ - local_38;
              auVar352._8_8_ = 0;
              auVar352._0_8_ = auVar43._0_8_ - local_38;
              auVar433._8_8_ = 0;
              auVar433._0_8_ = dVar3 * dVar3;
              auVar120 = vfmadd213sd_fma(auVar215,auVar352,auVar433);
              dVar22 = sin(dVar15);
              dVar20 = cos(dVar15);
              auVar505._8_8_ = 0;
              auVar505._0_8_ = -in_stack_00000018 * dVar22;
              auVar509._8_8_ = 0;
              auVar509._0_8_ = auVar70._0_8_ * auVar70._0_8_;
              auVar434._8_8_ = 0;
              auVar434._0_8_ = auVar24._0_8_;
              auVar476._8_8_ = 0;
              auVar476._0_8_ =
                   (((dVar17 * dVar19 * 3.141592653589793) / dVar14) * auVar23._0_8_) / dVar13;
              auVar216._8_8_ = 0;
              auVar216._0_8_ = (dVar16 * in_XMM0_Qa) / in_stack_00000018;
              auVar81._8_8_ = 0;
              auVar513._8_8_ = 0;
              auVar513._0_8_ = -((3.141592653589793 / local_80) * auVar70._0_8_ * dVar18 * dVar20);
              auVar23 = vfmadd213sd_fma(auVar505,auVar509,auVar513);
              auVar498._8_8_ = 0;
              auVar498._0_8_ =
                   ((auVar119._0_8_ * (auVar43._0_8_ - local_38)) / auVar120._0_8_) * dVar17 *
                   dVar17 * auVar23._0_8_;
              auVar23 = vfmadd213sd_fma(auVar434,auVar476,auVar498);
              auVar353._8_8_ = 0;
              auVar353._0_8_ = -(((dVar16 * in_XMM1_Qa) / in_stack_00000018) * auVar23._0_8_);
              auVar23 = vfmadd213sd_fma(auVar81,auVar216,auVar353);
              local_178 = auVar23._0_8_;
            }
            else {
              local_178 = 0;
            }
            if ((dVar13 != 0.0) || (NAN(dVar13))) {
              auVar354._0_8_ = (double)local_1a4;
              auVar354._8_8_ = 0;
              auVar217._8_8_ = 0;
              auVar217._0_8_ = *(ulong *)(in_RDI + 4);
              auVar435._8_8_ = 0;
              auVar435._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar23 = vfmadd213sd_fma(auVar217,auVar354,auVar435);
              auVar436._8_8_ = 0;
              auVar436._0_8_ = local_d8;
              auVar477._0_8_ = (double)local_1a8;
              auVar477._8_8_ = 0;
              auVar355._8_8_ = 0;
              auVar355._0_8_ = *(ulong *)(in_RDI + 6);
              auVar499._8_8_ = 0;
              auVar499._0_8_ = -dVar9;
              auVar24 = vfmadd213sd_fma(auVar355,auVar477,auVar499);
              auVar218._8_8_ = 0;
              auVar218._0_8_ = auVar23._0_8_ - in_stack_00000020;
              auVar356._8_8_ = 0;
              auVar356._0_8_ = ((auVar24._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_e0;
              auVar23 = vfmadd213sd_fma(auVar436,auVar218,auVar356);
              auVar357._0_8_ = (double)local_1ac;
              auVar357._8_8_ = 0;
              auVar219._8_8_ = 0;
              auVar219._0_8_ = *(ulong *)(in_RDI + 8);
              auVar478._8_8_ = 0;
              auVar478._0_8_ = -dVar10;
              auVar24 = vfmadd213sd_fma(auVar219,auVar357,auVar478);
              auVar220._8_8_ = 0;
              auVar220._0_8_ = local_e8;
              auVar358._8_8_ = 0;
              auVar358._0_8_ = (auVar24._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar23 = vfmadd213sd_fma(auVar220,auVar358,auVar23);
              dVar22 = sin(dVar15);
              dVar20 = cos(dVar15);
              auVar221._8_8_ = 0;
              auVar221._0_8_ = in_stack_00000018 * dVar22 * auVar70._0_8_;
              auVar82._8_8_ = 0;
              auVar82._0_8_ = auVar70._0_8_;
              auVar359._8_8_ = 0;
              auVar359._0_8_ = (3.141592653589793 / local_80) * dVar20 * auVar70._0_8_ * dVar18;
              auVar24 = vfmadd213sd_fma(auVar82,auVar221,auVar359);
              auVar87._0_8_ = auVar24._0_8_;
              auVar222._0_8_ = (double)local_1a4;
              auVar222._8_8_ = auVar24._8_8_;
              auVar83._8_8_ = 0;
              auVar83._0_8_ = *(ulong *)(in_RDI + 4);
              auVar360._8_8_ = 0;
              auVar360._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar119 = vfmadd213sd_fma(auVar83,auVar222,auVar360);
              auVar361._8_8_ = 0;
              auVar361._0_8_ = local_d8;
              auVar437._0_8_ = (double)local_1a8;
              auVar437._8_8_ = auVar24._8_8_;
              auVar223._8_8_ = 0;
              auVar223._0_8_ = *(ulong *)(in_RDI + 6);
              auVar479._8_8_ = 0;
              auVar479._0_8_ = -dVar9;
              auVar24 = vfmadd213sd_fma(auVar223,auVar437,auVar479);
              auVar84._8_8_ = 0;
              auVar84._0_8_ = auVar119._0_8_ - in_stack_00000020;
              auVar224._8_8_ = 0;
              auVar224._0_8_ = ((auVar24._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_e0;
              auVar24 = vfmadd213sd_fma(auVar361,auVar84,auVar224);
              auVar225._0_8_ = (double)local_1ac;
              auVar225._8_8_ = 0;
              auVar85._8_8_ = 0;
              auVar85._0_8_ = *(ulong *)(in_RDI + 8);
              auVar438._8_8_ = 0;
              auVar438._0_8_ = -dVar10;
              auVar119 = vfmadd213sd_fma(auVar85,auVar225,auVar438);
              auVar86._8_8_ = 0;
              auVar86._0_8_ = local_e8;
              auVar226._8_8_ = 0;
              auVar226._0_8_ = (auVar119._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar24 = vfmadd213sd_fma(auVar86,auVar226,auVar24);
              auVar227._8_8_ = 0;
              auVar227._0_8_ = auVar43._0_8_ - local_38;
              auVar362._8_8_ = 0;
              auVar362._0_8_ = auVar43._0_8_ - local_38;
              auVar439._8_8_ = 0;
              auVar439._0_8_ = dVar3 * dVar3;
              auVar119 = vfmadd213sd_fma(auVar227,auVar362,auVar439);
              dVar22 = cos(dVar15);
              dVar20 = sin(dVar15);
              auVar440._8_8_ = 0;
              auVar440._0_8_ = -in_stack_00000018 * dVar22;
              auVar480._8_8_ = 0;
              auVar480._0_8_ = auVar70._0_8_ * auVar70._0_8_;
              auVar228._8_8_ = 0;
              auVar228._0_8_ =
                   (((dVar17 * dVar19 * 3.141592653589793) / dVar14) * auVar23._0_8_) / dVar13;
              auVar87._8_8_ = 0;
              auVar500._8_8_ = 0;
              auVar500._0_8_ = (3.141592653589793 / local_80) * auVar70._0_8_ * dVar18 * dVar20;
              auVar23 = vfmadd213sd_fma(auVar440,auVar480,auVar500);
              auVar363._8_8_ = 0;
              auVar363._0_8_ =
                   ((auVar24._0_8_ * (auVar43._0_8_ - local_38)) / auVar119._0_8_) * dVar17 * dVar17
                   * auVar23._0_8_;
              auVar23 = vfmadd213sd_fma(auVar87,auVar228,auVar363);
              auVar93._0_8_ = auVar23._0_8_;
              auVar364._0_8_ = (double)local_1a4;
              auVar364._8_8_ = 0;
              auVar229._8_8_ = 0;
              auVar229._0_8_ = *(ulong *)(in_RDI + 4);
              auVar441._8_8_ = 0;
              auVar441._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar23 = vfmadd213sd_fma(auVar229,auVar364,auVar441);
              auVar442._8_8_ = 0;
              auVar442._0_8_ = local_c0;
              auVar481._0_8_ = (double)local_1a8;
              auVar481._8_8_ = 0;
              auVar365._8_8_ = 0;
              auVar365._0_8_ = *(ulong *)(in_RDI + 6);
              auVar501._8_8_ = 0;
              auVar501._0_8_ = -dVar9;
              auVar24 = vfmadd213sd_fma(auVar365,auVar481,auVar501);
              auVar230._8_8_ = 0;
              auVar230._0_8_ = auVar23._0_8_ - in_stack_00000020;
              auVar366._8_8_ = 0;
              auVar366._0_8_ = ((auVar24._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_c8;
              auVar23 = vfmadd213sd_fma(auVar442,auVar230,auVar366);
              auVar367._0_8_ = (double)local_1ac;
              auVar367._8_8_ = 0;
              auVar231._8_8_ = 0;
              auVar231._0_8_ = *(ulong *)(in_RDI + 8);
              auVar482._8_8_ = 0;
              auVar482._0_8_ = -dVar10;
              auVar24 = vfmadd213sd_fma(auVar231,auVar367,auVar482);
              auVar232._8_8_ = 0;
              auVar232._0_8_ = local_d0;
              auVar368._8_8_ = 0;
              auVar368._0_8_ = (auVar24._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar23 = vfmadd213sd_fma(auVar232,auVar368,auVar23);
              dVar22 = cos(dVar15);
              dVar20 = sin(dVar15);
              auVar233._8_8_ = 0;
              auVar233._0_8_ = -in_stack_00000018 * dVar22 * auVar70._0_8_;
              auVar88._8_8_ = 0;
              auVar88._0_8_ = auVar70._0_8_;
              auVar369._8_8_ = 0;
              auVar369._0_8_ = -((3.141592653589793 / local_80) * dVar20 * auVar70._0_8_ * dVar18);
              auVar24 = vfmadd213sd_fma(auVar88,auVar233,auVar369);
              auVar234._0_8_ = (double)local_1a4;
              auVar234._8_8_ = auVar24._8_8_;
              auVar89._8_8_ = 0;
              auVar89._0_8_ = *(ulong *)(in_RDI + 4);
              auVar370._8_8_ = 0;
              auVar370._0_8_ = in_XMM4_Qa ^ 0x8000000000000000;
              auVar119 = vfmadd213sd_fma(auVar89,auVar234,auVar370);
              auVar371._8_8_ = 0;
              auVar371._0_8_ = local_c0;
              auVar443._0_8_ = (double)local_1a8;
              auVar443._8_8_ = auVar24._8_8_;
              auVar235._8_8_ = 0;
              auVar235._0_8_ = *(ulong *)(in_RDI + 6);
              auVar483._8_8_ = 0;
              auVar483._0_8_ = -dVar9;
              auVar120 = vfmadd213sd_fma(auVar235,auVar443,auVar483);
              auVar90._8_8_ = 0;
              auVar90._0_8_ = auVar119._0_8_ - in_stack_00000020;
              auVar236._8_8_ = 0;
              auVar236._0_8_ = ((auVar120._0_8_ - in_XMM7_Qa) - in_stack_00000028) * local_c8;
              auVar119 = vfmadd213sd_fma(auVar371,auVar90,auVar236);
              auVar237._0_8_ = (double)local_1ac;
              auVar237._8_8_ = 0;
              auVar91._8_8_ = 0;
              auVar91._0_8_ = *(ulong *)(in_RDI + 8);
              auVar444._8_8_ = 0;
              auVar444._0_8_ = -dVar10;
              auVar120 = vfmadd213sd_fma(auVar91,auVar237,auVar444);
              auVar92._8_8_ = 0;
              auVar92._0_8_ = local_d0;
              auVar238._8_8_ = 0;
              auVar238._0_8_ = (auVar120._0_8_ - in_stack_00000008) - in_stack_00000030;
              auVar119 = vfmadd213sd_fma(auVar92,auVar238,auVar119);
              auVar239._8_8_ = 0;
              auVar239._0_8_ = auVar43._0_8_ - local_38;
              auVar372._8_8_ = 0;
              auVar372._0_8_ = auVar43._0_8_ - local_38;
              auVar445._8_8_ = 0;
              auVar445._0_8_ = dVar3 * dVar3;
              auVar120 = vfmadd213sd_fma(auVar239,auVar372,auVar445);
              dVar22 = sin(dVar15);
              dVar15 = cos(dVar15);
              auVar506._8_8_ = 0;
              auVar506._0_8_ = -in_stack_00000018 * dVar22;
              auVar510._8_8_ = 0;
              auVar510._0_8_ = auVar70._0_8_ * auVar70._0_8_;
              auVar446._8_8_ = 0;
              auVar446._0_8_ = auVar24._0_8_;
              auVar484._8_8_ = 0;
              auVar484._0_8_ =
                   (((dVar17 * dVar19 * 3.141592653589793) / dVar14) * auVar23._0_8_) / dVar13;
              auVar240._8_8_ = 0;
              auVar240._0_8_ = (dVar16 * in_XMM0_Qa) / in_stack_00000018;
              auVar93._8_8_ = 0;
              auVar514._8_8_ = 0;
              auVar514._0_8_ = -((3.141592653589793 / local_80) * auVar70._0_8_ * dVar18 * dVar15);
              auVar23 = vfmadd213sd_fma(auVar506,auVar510,auVar514);
              auVar502._8_8_ = 0;
              auVar502._0_8_ =
                   ((auVar119._0_8_ * (auVar43._0_8_ - local_38)) / auVar120._0_8_) * dVar17 *
                   dVar17 * auVar23._0_8_;
              auVar23 = vfmadd213sd_fma(auVar446,auVar484,auVar502);
              auVar373._8_8_ = 0;
              auVar373._0_8_ = ((dVar16 * in_XMM1_Qa) / in_stack_00000018) * auVar23._0_8_;
              auVar23 = vfmadd213sd_fma(auVar93,auVar240,auVar373);
              local_190 = auVar23._0_8_;
            }
            else {
              local_190 = 0;
            }
          }
          local_1a0 = local_180;
          if ((in_SIL & 1) == 0) {
            local_190 = local_190 ^ 0x8000000000000000;
            local_198 = -local_198;
            local_1a0 = -local_180;
          }
          if ((in_DL & 1) == 0) {
            auVar94._8_8_ = 0;
            auVar94._0_8_ = local_178;
            auVar374._8_8_ = 0;
            auVar374._0_8_ = auVar27._0_8_;
            auVar241._8_8_ = 0;
            auVar241._0_8_ = local_180 * local_c0;
            auVar23 = vfmadd213sd_fma(auVar374,auVar94,auVar241);
            auVar242._8_8_ = 0;
            auVar242._0_8_ = local_188;
            auVar95._8_8_ = 0;
            auVar95._0_8_ = local_d8;
            auVar23 = vfmadd213sd_fma(auVar95,auVar242,auVar23);
            pppcVar1 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar1)[local_1a8][local_1ac].ex = auVar23._0_8_;
            auVar96._8_8_ = 0;
            auVar96._0_8_ = local_178;
            auVar375._8_8_ = 0;
            auVar375._0_8_ = dVar11;
            auVar243._8_8_ = 0;
            auVar243._0_8_ = local_180 * local_c8;
            auVar23 = vfmadd213sd_fma(auVar375,auVar96,auVar243);
            auVar244._8_8_ = 0;
            auVar244._0_8_ = local_188;
            auVar97._8_8_ = 0;
            auVar97._0_8_ = local_e0;
            auVar23 = vfmadd213sd_fma(auVar97,auVar244,auVar23);
            pppcVar1 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar1)[local_1a8][local_1ac].ey = auVar23._0_8_;
            auVar98._8_8_ = 0;
            auVar98._0_8_ = local_178;
            auVar376._8_8_ = 0;
            auVar376._0_8_ = dVar12;
            auVar245._8_8_ = 0;
            auVar245._0_8_ = local_180 * local_d0;
            auVar23 = vfmadd213sd_fma(auVar376,auVar98,auVar245);
            auVar246._8_8_ = 0;
            auVar246._0_8_ = local_188;
            auVar99._8_8_ = 0;
            auVar99._0_8_ = local_e8;
            auVar23 = vfmadd213sd_fma(auVar99,auVar246,auVar23);
            pppcVar1 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar1)[local_1a8][local_1ac].ez = auVar23._0_8_;
            auVar100._8_8_ = 0;
            auVar100._0_8_ = local_190;
            auVar377._8_8_ = 0;
            auVar377._0_8_ = auVar27._0_8_;
            auVar247._8_8_ = 0;
            auVar247._0_8_ = local_198 * local_c0;
            auVar23 = vfmadd213sd_fma(auVar377,auVar100,auVar247);
            auVar248._8_8_ = 0;
            auVar248._0_8_ = local_1a0;
            auVar101._8_8_ = 0;
            auVar101._0_8_ = local_d8;
            auVar23 = vfmadd213sd_fma(auVar101,auVar248,auVar23);
            pppcVar2 = field3d<cellb>::operator[](in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar2)[local_1a8][local_1ac].bx = auVar23._0_8_;
            auVar102._8_8_ = 0;
            auVar102._0_8_ = local_190;
            auVar378._8_8_ = 0;
            auVar378._0_8_ = dVar11;
            auVar249._8_8_ = 0;
            auVar249._0_8_ = local_198 * local_c8;
            auVar23 = vfmadd213sd_fma(auVar378,auVar102,auVar249);
            auVar250._8_8_ = 0;
            auVar250._0_8_ = local_1a0;
            auVar103._8_8_ = 0;
            auVar103._0_8_ = local_e0;
            auVar23 = vfmadd213sd_fma(auVar103,auVar250,auVar23);
            pppcVar2 = field3d<cellb>::operator[](in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar2)[local_1a8][local_1ac].by = auVar23._0_8_;
            auVar104._8_8_ = 0;
            auVar104._0_8_ = local_190;
            auVar379._8_8_ = 0;
            auVar379._0_8_ = dVar12;
            auVar251._8_8_ = 0;
            auVar251._0_8_ = local_198 * local_d0;
            auVar23 = vfmadd213sd_fma(auVar379,auVar104,auVar251);
            auVar252._8_8_ = 0;
            auVar252._0_8_ = local_1a0;
            auVar265 = ZEXT1664(auVar252);
            auVar105._8_8_ = 0;
            auVar105._0_8_ = local_e8;
            auVar23 = vfmadd213sd_fma(auVar105,auVar252,auVar23);
            pppcVar2 = field3d<cellb>::operator[](in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar2)[local_1a8][local_1ac].bz = auVar23._0_8_;
          }
          else {
            auVar106._8_8_ = 0;
            auVar106._0_8_ = local_178;
            auVar380._8_8_ = 0;
            auVar380._0_8_ = auVar27._0_8_;
            auVar253._8_8_ = 0;
            auVar253._0_8_ = local_180 * local_c0;
            auVar23 = vfmadd213sd_fma(auVar380,auVar106,auVar253);
            auVar254._8_8_ = 0;
            auVar254._0_8_ = local_188;
            auVar107._8_8_ = 0;
            auVar107._0_8_ = local_d8;
            auVar23 = vfmadd213sd_fma(auVar107,auVar254,auVar23);
            in_stack_fffffffffffff9b8 = auVar23._0_8_;
            iVar515 = auVar23._4_4_;
            pppcVar1 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar1)[local_1a8][local_1ac].ex =
                 in_stack_fffffffffffff9b8 + (*pppcVar1)[local_1a8][local_1ac].ex;
            auVar108._8_8_ = 0;
            auVar108._0_8_ = local_178;
            auVar381._8_8_ = 0;
            auVar381._0_8_ = dVar11;
            auVar255._8_8_ = 0;
            auVar255._0_8_ = local_180 * local_c8;
            auVar23 = vfmadd213sd_fma(auVar381,auVar108,auVar255);
            auVar256._8_8_ = 0;
            auVar256._0_8_ = local_188;
            auVar109._8_8_ = 0;
            auVar109._0_8_ = local_e0;
            auVar23 = vfmadd213sd_fma(auVar109,auVar256,auVar23);
            in_stack_fffffffffffff9c0 = auVar23._0_8_;
            pppcVar1 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar1)[local_1a8][local_1ac].ey =
                 (double)in_stack_fffffffffffff9c0 + (*pppcVar1)[local_1a8][local_1ac].ey;
            auVar110._8_8_ = 0;
            auVar110._0_8_ = local_178;
            auVar382._8_8_ = 0;
            auVar382._0_8_ = dVar12;
            auVar257._8_8_ = 0;
            auVar257._0_8_ = local_180 * local_d0;
            auVar23 = vfmadd213sd_fma(auVar382,auVar110,auVar257);
            auVar258._8_8_ = 0;
            auVar258._0_8_ = local_188;
            auVar111._8_8_ = 0;
            auVar111._0_8_ = local_e8;
            auVar23 = vfmadd213sd_fma(auVar111,auVar258,auVar23);
            pppcVar1 = field3d<celle>::operator[]
                                 ((field3d<celle> *)in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar1)[local_1a8][local_1ac].ez =
                 auVar23._0_8_ + (*pppcVar1)[local_1a8][local_1ac].ez;
            auVar112._8_8_ = 0;
            auVar112._0_8_ = local_190;
            auVar383._8_8_ = 0;
            auVar383._0_8_ = auVar27._0_8_;
            auVar259._8_8_ = 0;
            auVar259._0_8_ = local_198 * local_c0;
            auVar23 = vfmadd213sd_fma(auVar383,auVar112,auVar259);
            auVar260._8_8_ = 0;
            auVar260._0_8_ = local_1a0;
            auVar113._8_8_ = 0;
            auVar113._0_8_ = local_d8;
            auVar23 = vfmadd213sd_fma(auVar113,auVar260,auVar23);
            pppcVar2 = field3d<cellb>::operator[](in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar2)[local_1a8][local_1ac].bx =
                 auVar23._0_8_ + (*pppcVar2)[local_1a8][local_1ac].bx;
            auVar114._8_8_ = 0;
            auVar114._0_8_ = local_190;
            auVar384._8_8_ = 0;
            auVar384._0_8_ = dVar11;
            auVar261._8_8_ = 0;
            auVar261._0_8_ = local_198 * local_c8;
            auVar23 = vfmadd213sd_fma(auVar384,auVar114,auVar261);
            auVar262._8_8_ = 0;
            auVar262._0_8_ = local_1a0;
            auVar115._8_8_ = 0;
            auVar115._0_8_ = local_e0;
            auVar23 = vfmadd213sd_fma(auVar115,auVar262,auVar23);
            pppcVar2 = field3d<cellb>::operator[](in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar2)[local_1a8][local_1ac].by =
                 auVar23._0_8_ + (*pppcVar2)[local_1a8][local_1ac].by;
            auVar116._8_8_ = 0;
            auVar116._0_8_ = local_190;
            auVar385._8_8_ = 0;
            auVar385._0_8_ = dVar12;
            auVar263._8_8_ = 0;
            auVar263._0_8_ = local_198 * local_d0;
            auVar23 = vfmadd213sd_fma(auVar385,auVar116,auVar263);
            auVar264._8_8_ = 0;
            auVar264._0_8_ = local_1a0;
            auVar265 = ZEXT1664(auVar264);
            auVar117._8_8_ = 0;
            auVar117._0_8_ = local_e8;
            auVar23 = vfmadd213sd_fma(auVar117,auVar264,auVar23);
            pppcVar2 = field3d<cellb>::operator[](in_stack_fffffffffffff9c0,iVar515);
            (*pppcVar2)[local_1a8][local_1ac].bz =
                 auVar23._0_8_ + (*pppcVar2)[local_1a8][local_1ac].bz;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void spatial_region::f_init_focused(double a0y, double a0z, double xsigma, double sigma0, double x0, double x1, bool b_sign, double phase, double y0, double z0, bool append, double phi, int sscos, double K, double xtarget, double ytarget, double ztarget)
{
    /* sigma0 - поперечный размер в перетяжке (импульс
     * аксиально-симметричный), x0 - положение центра лазерного
     * импульса, x1 - координата по x центра лазерного импульса
     * относительно центра перетяжки */
    /* y0, z0 - смещение центра импульса от оси области,
     * обеспечивающее нужный угол падения. Поворот импульса
     * производится так, что ey остаётся лежать в плоскости xy */
    /* ey задаётся симметричным (если бы импульс был плоским), ez -
     * антисимметричным (по продольной координате) */
    /* Интеграл от квадратов полей не вычисляется аналитически в
     * простой форме, поэтому используется \int a^2 dV. Поля задаются
     * таким образом, чтобы \int a^2 dV имел то же значение, что и для
     * f_init_gauss, поэтому вместо xsigma, ysigma и zsigma для
     * описания огибающей используются половины полных размеров
     * импульса xs и s (половина поперечного размера) */
    // K is a wavevector, K = 1 for first harmonic and 2 for the second.
    double sign = (x1<=0)-(x1>0);
    x1 = sqrt(x1*x1+y0*y0+z0*z0);
    if (x1==0) x1 = dx; // иначе не определён угол поворота импульса
    double xR = K * sigma0*sigma0/2;
    double sigma = sigma0*sqrt(1+x1*x1/xR/xR); // в начальном положении
    // ratio of first and second harmonics beam sizes at initial position
    double a_multiplier = sqrt(1 + x1 * x1 / (sigma0 * sigma0 * sigma0 * sigma0 / 4)) / sqrt(1 + x1 * x1 / (xR * xR));
    double xs = xsigma*2*sqrt(2*PI)/3;
    if ( sscos == 1 )
        xs = 0.822*xsigma;
    double s = sigma/2/sqrt(((double)3)/16-1/PI/PI);
    double s0 = sigma0/2/sqrt(((double)3)/16-1/PI/PI);
    double y12,z12;
    y12 = ny*dy/2;
    z12 = nz*dz/2;
    double r0x,r0y,r0z;
    r0x = sign*sqrt(x1*x1-y0*y0-z0*z0);
    r0x = r0x/x1;
    r0y = -y0/x1;
    r0z = -z0/x1;
    double y0x,y0y,y0z,z0x,z0y,z0z;
    y0z = sqrt( r0x*r0x + r0y*r0y );
    if (y0z!=0)
    {
        y0x = -r0y/y0z;
        y0y = r0x/y0z;
        y0z = 0;
    }
    else
    {
        y0x = 0;
        y0y = 1;
        y0z = 0;
    }
    z0x = r0y*y0z - r0z*y0y;
    z0y = r0z*y0x - r0x*y0z;
    z0z = r0x*y0y - r0y*y0x;
    if (phi!=0) {
        double c,s,yx,yy,yz,zx,zy,zz;
        c = cos(phi);
        s = sin(phi);
        yx = y0x;
        yy = y0y;
        yz = y0z;
        zx = z0x;
        zy = z0y;
        zz = z0z;
        y0x = yx*c + zx*s;
        y0y = yy*c + zy*s;
        y0z = yz*c + zz*s;
        z0x = zx*c - yx*s;
        z0y = zy*c - yy*s;
        z0z = zz*c - yz*s;
    }
    double xi,x,r,cosx,cosr,sinx,sinr;
    double slocal,alocal;
    double ex,ey,ez,bx,by,bz;
    for(int i=0;i<nx;i++)
    {
        for(int j=0;j<ny;j++)
        {
            for(int k=0;k<nz;k++)
            {
                x = r0x*(i*dx-x0-xtarget) + r0y*(j*dy-y12-y0-ytarget) + r0z*(k*dz-z12-z0-ztarget);
                r = sqrt( (i*dx-x0-xtarget)*(i*dx-x0-xtarget) + (j*dy-y12-y0-ytarget)*(j*dy-y12-y0-ytarget) + (k*dz-z12-z0-ztarget)*(k*dz-z12-z0-ztarget) - x*x );
                xi = x + r*r/2*(x-x1)/((x-x1)*(x-x1)+xR*xR) - atan((x-x1)/xR) - atan(x1/xR);
                slocal = s0*sqrt( 1 + (xi-x1+atan(x1/xR))*(xi-x1+atan(x1/xR))/(xR*xR) );
                alocal = s/slocal * a_multiplier;
                if ( xi>-xs && xi<xs && r<slocal )
                {
                    if ( sscos == 1 ) {
                        cosx = cos(PI*xi*xi*xi*xi/2/(xs*xs*xs*xs));
                        cosr = cos(PI*r/2/slocal);
                        sinx = sin(PI*xi*xi*xi*xi/2/(xs*xs*xs*xs));
                        sinr = sin(PI*r/2/slocal);
                        double xxi = K * xi + phase;
                        // envelope = (cosx*cosr)^2;
                        ey = alocal*a0y*cosr*cosr / K * (K * cos(xxi)*cosx*cosx - 4*PI*xi*xi*xi/(xs*xs*xs*xs)*sin(xxi)*cosx*sinx);
                        ez = -alocal*a0z*cosr*cosr / K * (K * sin(xxi)*cosx*cosx + 4*PI*xi*xi*xi/(xs*xs*xs*xs)*cos(xxi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        if (r!=0)
                            ex = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*( K * sin(xxi)*cosx*cosx+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*sin(xxi)) ) - alocal*a0z / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*((-K * cos(xxi))*cosx*cosx-4*PI*xi*xi*xi/(xs*xs*xs*xs)*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*cos(xxi)) );
                        else
                            ex = 0;
                        if (r!=0)
                            bx = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*(K * sin(xxi)*cosx*cosx+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*sin(xxi)) ) + alocal*a0z / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*((-K * cos(xxi))*cosx*cosx-4*PI*xi*xi*xi/(xs*xs*xs*xs)*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-4*PI*xi*xi*xi/(xs*xs*xs*xs)*cosx*sinx*cos(xxi)) );
                        else
                            bx = 0;
                    } else if (-2 * s0 * (x1 - x) / xR <= r && r <= 2 * s0 * (x1 - x) / xR) { // otherwise unphysical wings arise
                        cosx = cos(PI*xi/2/xs);
                        cosr = cos(PI*r/2/slocal);
                        sinx = sin(PI*xi/2/xs);
                        sinr = sin(PI*r/2/slocal);
                        double xxi = K * xi + phase;
                        // envelope = (cosx*cosr)^2;
                        ey = alocal*a0y*cosr*cosr / K * (K * cos(xxi)*cosx*cosx - PI/xs*sin(xxi)*cosx*sinx);
                        ez = -alocal*a0z*cosr*cosr / K * (K * sin(xxi)*cosx*cosx + PI/xs*cos(xxi)*cosx*sinx);
                        bz = ey;
                        by = -ez;
                        if (r!=0)
                            ex = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*(K * sin(xxi)*cosx*cosx+PI/xs*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+PI/xs*cosx*sinx*sin(xxi)) ) - alocal*a0z / K *( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*((-K * cos(xxi))*cosx*cosx-PI/xs*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-PI/xs*cosx*sinx*cos(xxi)) );
                        else
                            ex = 0;
                        if (r!=0)
                            bx = alocal*a0y / K * ( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)/r*(K * sin(xxi)*cosx*cosx+PI/xs*cos(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*z0x+(j*dy-y12-y0-ytarget)*z0y+(k*dz-z12-z0-ztarget)*z0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * cos(xxi))+PI/xs*cosx*sinx*sin(xxi)) ) + alocal*a0z / K *( cosr*sinr*PI/slocal*((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)/r*((-K * cos(xxi))*cosx*cosx-PI/xs*sin(xxi)*cosx*sinx) + ((i*dx-x0-xtarget)*y0x+(j*dy-y12-y0-ytarget)*y0y+(k*dz-z12-z0-ztarget)*y0z)*(x-x1)/((x-x1)*(x-x1)+xR*xR)*cosr*cosr*(cosx*cosx*(-K * sin(xxi))-PI/xs*cosx*sinx*cos(xxi)) );
                        else
                            bx = 0;
                    } else {
                        ex = 0;
                        ey = 0;
                        ez = 0;
                        bx = 0;
                        by = 0;
                        bz = 0;
                    }
                    if (b_sign==0)
                    {
                        bx = -bx;
                        by = -by;
                        bz = -bz;
                    }
                    if (append==0)
                    {
                        // прежние значения перезаписываются
                        ce[i][j][k].ex = ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey = ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez = ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx = bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by = bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz = bx*r0z + by*y0z + bz*z0z;
                    }
                    else
                    {
                        // импульс добавляется к имеющимся полям
                        ce[i][j][k].ex += ex*r0x + ey*y0x + ez*z0x;
                        ce[i][j][k].ey += ex*r0y + ey*y0y + ez*z0y;
                        ce[i][j][k].ez += ex*r0z + ey*y0z + ez*z0z;
                        cb[i][j][k].bx += bx*r0x + by*y0x + bz*z0x;
                        cb[i][j][k].by += bx*r0y + by*y0y + bz*z0y;
                        cb[i][j][k].bz += bx*r0z + by*y0z + bz*z0z;
                    }
                }
                else if (append==0)
                {
                    ce[i][j][k].ex = 0;
                    ce[i][j][k].ey = 0;
                    ce[i][j][k].ez = 0;
                    cb[i][j][k].bx = 0;
                    cb[i][j][k].by = 0;
                    cb[i][j][k].bz = 0;
                }
            }
        }
    }
}